

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::getElementAttValue
          (TraverseSchema *this,DOMElement *elem,XMLCh *attName,ValidatorType attType)

{
  short sVar1;
  XMLStringPool *pXVar2;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_00;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  XMLCh *pXVar7;
  DatatypeValidator *pDVar8;
  undefined4 extraout_var_00;
  ArrayJanitor<char16_t> tempName;
  ArrayJanitor<char16_t> local_30;
  long *plVar6;
  
  iVar4 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,attName);
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  if (plVar6 == (long *)0x0) {
    pXVar7 = (XMLCh *)0x0;
  }
  else {
    pXVar7 = (XMLCh *)(**(code **)(*plVar6 + 0x150))(plVar6);
    this_00 = DatatypeValidatorFactory::fBuiltInRegistry;
    if ((int)attType < 0x14) {
      if (getElementAttValue(xercesc_4_0::DOMElement_const*,char16_t_const*,xercesc_4_0::DatatypeValidator::ValidatorType)
          ::bInitialized == '\0') {
        getElementAttValue(xercesc_4_0::DOMElement_const*,char16_t_const*,xercesc_4_0::DatatypeValidator::ValidatorType)
        ::bInitialized = '\x01';
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (DatatypeValidatorFactory::fBuiltInRegistry,SchemaSymbols::fgDT_STRING);
        getElementAttValue::wsFacets[0] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_ANYURI);
        getElementAttValue::wsFacets[1] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_QNAME);
        getElementAttValue::wsFacets[2] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_NAME);
        getElementAttValue::wsFacets[3] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_NCNAME);
        getElementAttValue::wsFacets[4] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_BOOLEAN);
        getElementAttValue::wsFacets[5] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_FLOAT);
        getElementAttValue::wsFacets[6] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_DOUBLE);
        getElementAttValue::wsFacets[7] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_DECIMAL);
        getElementAttValue::wsFacets[8] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_HEXBINARY);
        getElementAttValue::wsFacets[9] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_BASE64BINARY);
        getElementAttValue::wsFacets[10] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_DURATION);
        getElementAttValue::wsFacets[0xb] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_DATETIME);
        getElementAttValue::wsFacets[0xc] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_DATE);
        getElementAttValue::wsFacets[0xd] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_TIME);
        getElementAttValue::wsFacets[0xe] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_MONTHDAY);
        getElementAttValue::wsFacets[0xf] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_YEARMONTH);
        getElementAttValue::wsFacets[0x10] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_YEAR);
        getElementAttValue::wsFacets[0x11] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_MONTH);
        getElementAttValue::wsFacets[0x12] = pDVar8->fWhiteSpace;
        pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                           (this_00,SchemaSymbols::fgDT_DAY);
        getElementAttValue::wsFacets[0x13] = pDVar8->fWhiteSpace;
      }
      sVar1 = getElementAttValue::wsFacets[attType];
      if (sVar1 == 1) {
        bVar3 = XMLString::isWSReplaced(pXVar7);
      }
      else {
        if (sVar1 != 2) {
          return pXVar7;
        }
        bVar3 = XMLString::isWSCollapsed(pXVar7);
      }
      if (bVar3 == false) {
        pXVar7 = XMLString::replicate(pXVar7,this->fMemoryManager);
        ArrayJanitor<char16_t>::ArrayJanitor(&local_30,pXVar7,this->fMemoryManager);
        if (sVar1 == 1) {
          XMLString::replaceWS(pXVar7,this->fMemoryManager);
        }
        else {
          XMLString::collapseWS(pXVar7,this->fMemoryManager);
        }
        if (*pXVar7 == L'\0') {
          pXVar7 = L"";
        }
        else {
          pXVar2 = this->fStringPool;
          uVar5 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[5])(pXVar2,pXVar7);
          iVar4 = (*(pXVar2->super_XSerializable)._vptr_XSerializable[10])(pXVar2,(ulong)uVar5);
          pXVar7 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
        }
        ArrayJanitor<char16_t>::~ArrayJanitor(&local_30);
      }
    }
  }
  return pXVar7;
}

Assistant:

const XMLCh* TraverseSchema::getElementAttValue(const DOMElement* const elem,
                                                const XMLCh* const attName,
                                                const DatatypeValidator::ValidatorType attType /* = UnKnown */) {

    DOMAttr* attNode = elem->getAttributeNode(attName);

    if (attNode == 0) {
        return 0;
    }

    const XMLCh* attValue = attNode->getValue();

    if (attType < DatatypeValidator::ID) {
        static bool bInitialized = false;
        static short wsFacets[DatatypeValidator::ID] = {0};
        if(!bInitialized)
        {
            bInitialized=true;
            DVHashTable* registry = DatatypeValidatorFactory::getBuiltInRegistry();
            wsFacets[DatatypeValidator::String]      = registry->get(SchemaSymbols::fgDT_STRING)->getWSFacet();
            wsFacets[DatatypeValidator::AnyURI]      = registry->get(SchemaSymbols::fgDT_ANYURI)->getWSFacet();
            wsFacets[DatatypeValidator::QName]       = registry->get(SchemaSymbols::fgDT_QNAME)->getWSFacet();
            wsFacets[DatatypeValidator::Name]        = registry->get(SchemaSymbols::fgDT_NAME)->getWSFacet();
            wsFacets[DatatypeValidator::NCName]      = registry->get(SchemaSymbols::fgDT_NCNAME)->getWSFacet();
            wsFacets[DatatypeValidator::Boolean]     = registry->get(SchemaSymbols::fgDT_BOOLEAN)->getWSFacet();
            wsFacets[DatatypeValidator::Float]       = registry->get(SchemaSymbols::fgDT_FLOAT)->getWSFacet();
            wsFacets[DatatypeValidator::Double]      = registry->get(SchemaSymbols::fgDT_DOUBLE)->getWSFacet();
            wsFacets[DatatypeValidator::Decimal]     = registry->get(SchemaSymbols::fgDT_DECIMAL)->getWSFacet();
            wsFacets[DatatypeValidator::HexBinary]   = registry->get(SchemaSymbols::fgDT_HEXBINARY)->getWSFacet();
            wsFacets[DatatypeValidator::Base64Binary]= registry->get(SchemaSymbols::fgDT_BASE64BINARY)->getWSFacet();
            wsFacets[DatatypeValidator::Duration]    = registry->get(SchemaSymbols::fgDT_DURATION)->getWSFacet();
            wsFacets[DatatypeValidator::DateTime]    = registry->get(SchemaSymbols::fgDT_DATETIME)->getWSFacet();
            wsFacets[DatatypeValidator::Date]        = registry->get(SchemaSymbols::fgDT_DATE)->getWSFacet();
            wsFacets[DatatypeValidator::Time]        = registry->get(SchemaSymbols::fgDT_TIME)->getWSFacet();
            wsFacets[DatatypeValidator::MonthDay]    = registry->get(SchemaSymbols::fgDT_MONTHDAY)->getWSFacet();
            wsFacets[DatatypeValidator::YearMonth]   = registry->get(SchemaSymbols::fgDT_YEARMONTH)->getWSFacet();
            wsFacets[DatatypeValidator::Year]        = registry->get(SchemaSymbols::fgDT_YEAR)->getWSFacet();
            wsFacets[DatatypeValidator::Month]       = registry->get(SchemaSymbols::fgDT_MONTH)->getWSFacet();
            wsFacets[DatatypeValidator::Day]         = registry->get(SchemaSymbols::fgDT_DAY)->getWSFacet();
        }
        short wsFacet = wsFacets[attType];
        if((wsFacet == DatatypeValidator::REPLACE && !XMLString::isWSReplaced(attValue)) ||
           (wsFacet == DatatypeValidator::COLLAPSE && !XMLString::isWSCollapsed(attValue)))
        {
            XMLCh* normalizedValue=XMLString::replicate(attValue, fMemoryManager);
            ArrayJanitor<XMLCh> tempName(normalizedValue, fMemoryManager);
            if(wsFacet == DatatypeValidator::REPLACE)
                XMLString::replaceWS(normalizedValue, fMemoryManager);
            else if(wsFacet == DatatypeValidator::COLLAPSE)
                XMLString::collapseWS(normalizedValue, fMemoryManager);
            if (!*normalizedValue)
                return XMLUni::fgZeroLenString;
            return fStringPool->getValueForId(fStringPool->addOrFind(normalizedValue));
        }
    }

    return attValue;
}